

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void replaceFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uchar *puVar7;
  uchar *__s2;
  uchar *__src;
  char *z;
  char *pcVar8;
  int iVar9;
  long local_58;
  
  puVar7 = sqlite3_value_text(*argv);
  if (puVar7 != (uchar *)0x0) {
    iVar2 = sqlite3_value_bytes(*argv);
    __s2 = sqlite3_value_text(argv[1]);
    if (__s2 != (uchar *)0x0) {
      if (*__s2 == '\0') {
        sqlite3VdbeMemCopy(&context->s,*argv);
        return;
      }
      iVar3 = sqlite3_value_bytes(argv[1]);
      __src = sqlite3_value_text(argv[2]);
      if (__src != (uchar *)0x0) {
        iVar4 = sqlite3_value_bytes(argv[2]);
        local_58 = (long)(iVar2 + 1);
        z = (char *)contextMalloc(context,local_58);
        if (z != (char *)0x0) {
          iVar9 = 0;
          iVar5 = 0;
          do {
            if (iVar2 - iVar3 < iVar9) {
              memcpy(z + iVar5,puVar7 + iVar9,(long)(iVar2 - iVar9));
              iVar5 = (iVar2 - iVar9) + iVar5;
              z[iVar5] = '\0';
              sqlite3_result_text(context,z,iVar5,sqlite3_free);
              return;
            }
            uVar1 = puVar7[iVar9];
            if (uVar1 == *__s2) {
              iVar6 = bcmp(puVar7 + iVar9,__s2,(long)iVar3);
              if (iVar6 != 0) goto LAB_00164fe0;
              if ((long)((context->s).db)->aLimit[0] < local_58 + (iVar4 - iVar3) + -1) {
                sqlite3_result_error_toobig(context);
LAB_001650f1:
                sqlite3_free(z);
                return;
              }
              local_58 = local_58 + (iVar4 - iVar3);
              pcVar8 = (char *)sqlite3_realloc(z,(int)local_58);
              if (pcVar8 == (char *)0x0) {
                sqlite3_result_error_nomem(context);
                goto LAB_001650f1;
              }
              memcpy(pcVar8 + iVar5,__src,(long)iVar4);
              iVar5 = iVar5 + iVar4;
              iVar9 = iVar9 + iVar3 + -1;
            }
            else {
LAB_00164fe0:
              z[iVar5] = uVar1;
              pcVar8 = z;
              iVar5 = iVar5 + 1;
            }
            iVar9 = iVar9 + 1;
            z = pcVar8;
          } while( true );
        }
      }
    }
  }
  return;
}

Assistant:

static void replaceFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zStr;        /* The input string A */
  const unsigned char *zPattern;    /* The pattern string B */
  const unsigned char *zRep;        /* The replacement string C */
  unsigned char *zOut;              /* The output */
  int nStr;                /* Size of zStr */
  int nPattern;            /* Size of zPattern */
  int nRep;                /* Size of zRep */
  i64 nOut;                /* Maximum size of zOut */
  int loopLimit;           /* Last zStr[] that might match zPattern[] */
  int i, j;                /* Loop counters */

  assert( argc==3 );
  UNUSED_PARAMETER(argc);
  zStr = sqlite3_value_text(argv[0]);
  if( zStr==0 ) return;
  nStr = sqlite3_value_bytes(argv[0]);
  assert( zStr==sqlite3_value_text(argv[0]) );  /* No encoding change */
  zPattern = sqlite3_value_text(argv[1]);
  if( zPattern==0 ){
    assert( sqlite3_value_type(argv[1])==SQLITE_NULL
            || sqlite3_context_db_handle(context)->mallocFailed );
    return;
  }
  if( zPattern[0]==0 ){
    assert( sqlite3_value_type(argv[1])!=SQLITE_NULL );
    sqlite3_result_value(context, argv[0]);
    return;
  }
  nPattern = sqlite3_value_bytes(argv[1]);
  assert( zPattern==sqlite3_value_text(argv[1]) );  /* No encoding change */
  zRep = sqlite3_value_text(argv[2]);
  if( zRep==0 ) return;
  nRep = sqlite3_value_bytes(argv[2]);
  assert( zRep==sqlite3_value_text(argv[2]) );
  nOut = nStr + 1;
  assert( nOut<SQLITE_MAX_LENGTH );
  zOut = contextMalloc(context, (i64)nOut);
  if( zOut==0 ){
    return;
  }
  loopLimit = nStr - nPattern;  
  for(i=j=0; i<=loopLimit; i++){
    if( zStr[i]!=zPattern[0] || memcmp(&zStr[i], zPattern, nPattern) ){
      zOut[j++] = zStr[i];
    }else{
      u8 *zOld;
      sqlite3 *db = sqlite3_context_db_handle(context);
      nOut += nRep - nPattern;
      testcase( nOut-1==db->aLimit[SQLITE_LIMIT_LENGTH] );
      testcase( nOut-2==db->aLimit[SQLITE_LIMIT_LENGTH] );
      if( nOut-1>db->aLimit[SQLITE_LIMIT_LENGTH] ){
        sqlite3_result_error_toobig(context);
        sqlite3_free(zOut);
        return;
      }
      zOld = zOut;
      zOut = sqlite3_realloc(zOut, (int)nOut);
      if( zOut==0 ){
        sqlite3_result_error_nomem(context);
        sqlite3_free(zOld);
        return;
      }
      memcpy(&zOut[j], zRep, nRep);
      j += nRep;
      i += nPattern-1;
    }
  }
  assert( j+nStr-i+1==nOut );
  memcpy(&zOut[j], &zStr[i], nStr-i);
  j += nStr - i;
  assert( j<=nOut );
  zOut[j] = 0;
  sqlite3_result_text(context, (char*)zOut, j, sqlite3_free);
}